

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

ForNonContainerNonPointer<nonstd::expected_lite::expected<void,_int>,_std::string> * __thiscall
lest::to_string<nonstd::expected_lite::expected<void,int>>
          (ForNonContainerNonPointer<nonstd::expected_lite::expected<void,_int>,_std::string>
           *__return_storage_ptr__,lest *this,expected<void,_int> *item)

{
  expected<void,_int> *item_local;
  
  make_string<nonstd::expected_lite::expected<void,int>>(__return_storage_ptr__,this,item);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( T const & item ) -> ForNonContainerNonPointer<T, std::string>
{
    return make_string( item );
}